

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void Vec_IntPermute(Vec_Int_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  time_t tVar5;
  long lVar6;
  
  iVar1 = p->nSize;
  piVar3 = p->pArray;
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  if (0 < (long)iVar1) {
    lVar6 = 0;
    do {
      iVar4 = rand();
      iVar2 = piVar3[lVar6];
      piVar3[lVar6] = piVar3[iVar4 % iVar1];
      piVar3[iVar4 % iVar1] = iVar2;
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  return;
}

Assistant:

void Vec_IntPermute( Vec_Int_t * p )
{
    int i, nSize = Vec_IntSize( p );
    int * pArray = Vec_IntArray( p );
    srand( time(NULL) );
    for ( i = 0; i < nSize; i++ )
    {
        int j = rand()%nSize;
        ABC_SWAP( int, pArray[i], pArray[j] );
    }
}